

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 03_signal_epoll.c
# Opt level: O0

int setup_listening_socket(int port)

{
  int iVar1;
  undefined4 local_24;
  undefined1 local_20 [4];
  int enable;
  sockaddr_in srv_addr;
  int sock;
  int port_local;
  
  srv_addr.sin_zero._4_4_ = port;
  srv_addr.sin_zero._0_4_ = socket(2,1,0);
  if (srv_addr.sin_zero._0_4_ == -1) {
    perror("socket()");
    exit(1);
  }
  local_24 = 1;
  iVar1 = setsockopt(srv_addr.sin_zero._0_4_,1,2,&local_24,4);
  if (iVar1 < 0) {
    perror("setsockopt(SO_REUSEADDR)");
    exit(1);
  }
  memset(local_20,0,0x10);
  local_20._0_2_ = 2;
  local_20._2_2_ = htons(srv_addr.sin_zero._4_2_);
  enable = htonl(0);
  iVar1 = bind(srv_addr.sin_zero._0_4_,(sockaddr *)local_20,0x10);
  if (iVar1 < 0) {
    perror("bind()");
    exit(1);
  }
  iVar1 = listen(srv_addr.sin_zero._0_4_,10);
  if (iVar1 < 0) {
    perror("listen()");
    exit(1);
  }
  iVar1._0_1_ = srv_addr.sin_zero[0];
  iVar1._1_1_ = srv_addr.sin_zero[1];
  iVar1._2_1_ = srv_addr.sin_zero[2];
  iVar1._3_1_ = srv_addr.sin_zero[3];
  return iVar1;
}

Assistant:

int setup_listening_socket(int port) {
    int sock;
    struct sockaddr_in srv_addr;

    sock = socket(PF_INET, SOCK_STREAM, 0);
    if (sock == -1)
        handle_error("socket()");

    int enable = 1;
    if (setsockopt(sock,
                   SOL_SOCKET, SO_REUSEADDR,
                   &enable, sizeof(int)) < 0)
        handle_error("setsockopt(SO_REUSEADDR)");


    memset(&srv_addr, 0, sizeof(srv_addr));
    srv_addr.sin_family = AF_INET;
    srv_addr.sin_port = htons(port);
    srv_addr.sin_addr.s_addr = htonl(INADDR_ANY);

    /* We bind to a port and turn this socket into a listening
     * socket.
     * */
    if (bind(sock,
             (const struct sockaddr *)&srv_addr,
             sizeof(srv_addr)) < 0)
        handle_error("bind()");

    if (listen(sock, 10) < 0)
        handle_error("listen()");

    return (sock);
}